

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O1

int __thiscall Stream::advance(Stream *this)

{
  int *piVar1;
  int iVar2;
  
  std::istream::get();
  iVar2 = std::istream::peek();
  if (iVar2 == 10) {
    (this->mark_).line = (this->mark_).line + 1;
    (this->mark_).column = 0;
  }
  else {
    piVar1 = &(this->mark_).column;
    *piVar1 = *piVar1 + 1;
  }
  return iVar2;
}

Assistant:

int Stream::advance()
{
  is_.get();
  int c = is_.peek();

  if(c == '\n')
    mark_.newLine();
  else 
    mark_.advance();

  return c;
}